

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XIncludeUtils::doDOMNodeXInclude
          (XIncludeUtils *this,DOMNode *xincludeNode,DOMDocument *parsedDocument,
          XMLEntityHandler *entityResolver)

{
  XMLCh XVar1;
  XMLCh XVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  XMLSize_t index;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNode *pDVar9;
  long *plVar10;
  undefined2 *puVar11;
  undefined4 extraout_var_01;
  XMLCh *pXVar12;
  DOMNode *pDVar13;
  long *plVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  DOMDocument *pDVar15;
  undefined4 extraout_var_07;
  DOMText *pDVar16;
  undefined4 extraout_var_08;
  long lVar17;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long *plVar18;
  undefined4 extraout_var_12;
  DOMNode *pDVar19;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  short *psVar20;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined8 uVar21;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  DOMNode *pDVar22;
  short *psVar23;
  Codes CVar24;
  XMLSize_t XVar25;
  long lVar26;
  XMLCh *pXVar27;
  bool bVar28;
  XIncludeLocation hrefLoc;
  XIncludeLocation relativeLocation;
  XIncludeLocation xil;
  RefVectorOf<xercesc_4_0::DOMNode> delayedProcessing;
  XMLUri includedURI;
  XMLUri parentURI;
  DOMNode *local_168;
  XMLCh *local_158;
  long local_150;
  XIncludeLocation local_140;
  XMLCh *local_138;
  XIncludeLocation local_130;
  XMLEntityHandler *local_128;
  XIncludeLocation local_120;
  BaseRefVectorOf<xercesc_4_0::DOMNode> local_118;
  DOMNode *local_e8;
  XMLUri local_e0;
  XMLUri local_88;
  
  pDVar13 = xincludeNode;
  local_128 = entityResolver;
  iVar7 = (*xincludeNode->_vptr_DOMNode[5])(xincludeNode);
  local_e8 = (DOMNode *)CONCAT44(extraout_var,iVar7);
  iVar7 = (*xincludeNode->_vptr_DOMNode[0x1a])(xincludeNode);
  if ((char)iVar7 == '\0') {
    bVar28 = true;
    local_158 = (XMLCh *)0x0;
    pXVar27 = (XMLCh *)0x0;
    local_168 = (DOMNode *)0x0;
  }
  else {
    iVar7 = (*xincludeNode->_vptr_DOMNode[0xb])(xincludeNode);
    plVar14 = (long *)CONCAT44(extraout_var_00,iVar7);
    pDVar9 = (DOMNode *)(**(code **)(*plVar14 + 0x28))(plVar14);
    if (pDVar9 == (DOMNode *)0x0) {
      bVar28 = true;
      local_158 = (XMLCh *)0x0;
      pXVar27 = (XMLCh *)0x0;
      local_168 = (DOMNode *)0x0;
    }
    else {
      local_168 = (DOMNode *)0x0;
      local_138 = (XMLCh *)0x0;
      local_150 = 0;
      local_158 = (XMLCh *)0x0;
      pDVar19 = (DOMNode *)0x0;
      do {
        pDVar13 = pDVar19;
        plVar10 = (long *)(**(code **)(*plVar14 + 0x18))(plVar14);
        puVar11 = (undefined2 *)(**(code **)(*plVar10 + 0x140))(plVar10);
        if (puVar11 == &fgXIIncludeHREFAttrName) {
LAB_00345947:
          local_168 = (DOMNode *)(**(code **)(*plVar10 + 0x150))(plVar10);
        }
        else {
          if (puVar11 != (undefined2 *)0x0) {
            pDVar22 = (DOMNode *)0x0;
            do {
              psVar20 = (short *)((long)puVar11 + (long)pDVar22);
              if (*psVar20 == 0) {
                if (*(short *)((long)&fgXIIncludeHREFAttrName + (long)pDVar22) == 0)
                goto LAB_00345947;
                break;
              }
              pDVar13 = (DOMNode *)((long)&pDVar22->_vptr_DOMNode + 2);
              psVar23 = (short *)((long)&fgXIIncludeHREFAttrName + (long)pDVar22);
              pDVar22 = pDVar13;
            } while (*psVar20 == *psVar23);
          }
          if (puVar11 == &fgXIIncludeParseAttrName) {
LAB_0034598a:
            local_138 = (XMLCh *)(**(code **)(*plVar10 + 0x150))(plVar10);
          }
          else {
            if (puVar11 != (undefined2 *)0x0) {
              pDVar22 = (DOMNode *)0x0;
              do {
                psVar20 = (short *)((long)puVar11 + (long)pDVar22);
                if (*psVar20 == 0) {
                  if (*(short *)((long)&fgXIIncludeParseAttrName + (long)pDVar22) == 0)
                  goto LAB_0034598a;
                  break;
                }
                pDVar13 = (DOMNode *)((long)&pDVar22->_vptr_DOMNode + 2);
                psVar23 = (short *)((long)&fgXIIncludeParseAttrName + (long)pDVar22);
                pDVar22 = pDVar13;
              } while (*psVar20 == *psVar23);
            }
            if (puVar11 == &fgXIIncludeXPointerAttrName) {
LAB_003459c9:
              local_150 = (**(code **)(*plVar10 + 0x150))(plVar10);
            }
            else {
              if (puVar11 != (undefined2 *)0x0) {
                pDVar22 = (DOMNode *)0x0;
                do {
                  psVar20 = (short *)((long)puVar11 + (long)pDVar22);
                  if (*psVar20 == 0) {
                    if (*(short *)((long)&fgXIIncludeXPointerAttrName + (long)pDVar22) == 0)
                    goto LAB_003459c9;
                    break;
                  }
                  pDVar13 = (DOMNode *)((long)&pDVar22->_vptr_DOMNode + 2);
                  psVar23 = (short *)((long)&fgXIIncludeXPointerAttrName + (long)pDVar22);
                  pDVar22 = pDVar13;
                } while (*psVar20 == *psVar23);
              }
              if (puVar11 == &fgXIIncludeEncodingAttrName) {
LAB_003459f1:
                local_158 = (XMLCh *)(**(code **)(*plVar10 + 0x150))(plVar10);
              }
              else {
                if (puVar11 != (undefined2 *)0x0) {
                  pDVar22 = (DOMNode *)0x0;
                  do {
                    psVar20 = (short *)((long)puVar11 + (long)pDVar22);
                    if (*psVar20 == 0) {
                      if (*(short *)((long)&fgXIIncludeEncodingAttrName + (long)pDVar22) == 0)
                      goto LAB_003459f1;
                      break;
                    }
                    pDVar13 = (DOMNode *)((long)&pDVar22->_vptr_DOMNode + 2);
                    psVar23 = (short *)((long)&fgXIIncludeEncodingAttrName + (long)pDVar22);
                    pDVar22 = pDVar13;
                  } while (*psVar20 == *psVar23);
                }
                (**(code **)(*plVar10 + 0xb0))(plVar10);
              }
            }
          }
        }
        pDVar19 = (DOMNode *)((long)&pDVar19->_vptr_DOMNode + 1);
      } while (pDVar19 != pDVar9);
      bVar28 = local_150 == 0;
      pXVar27 = local_138;
    }
  }
  iVar7 = (*xincludeNode->_vptr_DOMNode[7])();
  plVar14 = (long *)CONCAT44(extraout_var_01,iVar7);
  if (plVar14 == (long *)0x0) {
    plVar10 = (long *)0x0;
  }
  else {
    plVar10 = (long *)0x0;
    do {
      iVar7 = (**(code **)(*plVar14 + 0x20))(plVar14);
      if (iVar7 == 1) {
        pXVar12 = (XMLCh *)(**(code **)(*plVar14 + 0xc0))(plVar14);
        pDVar13 = (DOMNode *)(**(code **)(*plVar14 + 0xb0))(plVar14);
        bVar5 = isXIFallbackElement(pXVar12,(XMLCh *)pDVar13);
        if (bVar5) {
          bVar5 = plVar10 != (long *)0x0;
          plVar10 = plVar14;
          if (bVar5) {
            iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                              (parsedDocument);
            pXVar27 = (XMLCh *)CONCAT44(extraout_var_05,iVar7);
            iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                              (parsedDocument);
            pXVar12 = (XMLCh *)CONCAT44(extraout_var_06,iVar7);
            CVar24 = XIncludeMultipleFallbackElems;
LAB_00345c9d:
            reportError(this,pDVar13,CVar24,pXVar27,pXVar12);
            return false;
          }
        }
        else {
          pXVar12 = (XMLCh *)(**(code **)(*plVar14 + 0xc0))(plVar14);
          pDVar13 = (DOMNode *)(**(code **)(*plVar14 + 0xb0))(plVar14);
          bVar5 = isXIIncludeElement(pXVar12,(XMLCh *)pDVar13);
          if ((bVar5) ||
             (puVar11 = (undefined2 *)(**(code **)(*plVar14 + 0xb0))(plVar14),
             puVar11 == &fgXIIIncludeNamespaceURI)) {
LAB_00345c51:
            pXVar27 = (XMLCh *)(**(code **)(*plVar14 + 0x10))(plVar14);
            iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
            pXVar12 = (XMLCh *)CONCAT44(extraout_var_04,iVar7);
            CVar24 = XIncludeDisallowedChild;
            goto LAB_00345c9d;
          }
          if (puVar11 != (undefined2 *)0x0) {
            pDVar9 = (DOMNode *)0x0;
            do {
              psVar20 = (short *)((long)puVar11 + (long)pDVar9);
              if (*psVar20 == 0) {
                if (*(short *)((long)&fgXIIIncludeNamespaceURI + (long)pDVar9) == 0)
                goto LAB_00345c51;
                break;
              }
              pDVar13 = (DOMNode *)((long)&pDVar9->_vptr_DOMNode + 2);
              psVar23 = (short *)((long)&fgXIIIncludeNamespaceURI + (long)pDVar9);
              pDVar9 = pDVar13;
            } while (*psVar20 == *psVar23);
          }
        }
      }
      plVar14 = (long *)(**(code **)(*plVar14 + 0x50))(plVar14);
    } while (plVar14 != (long *)0x0);
  }
  if (local_168 == (DOMNode *)0x0) {
    iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    local_168 = (DOMNode *)CONCAT44(extraout_var_03,iVar7);
    CVar24 = XIncludeNoHref;
LAB_00345c47:
    reportError(this,pDVar13,CVar24,(XMLCh *)0x0,(XMLCh *)local_168);
    return false;
  }
  if (pXVar27 == (XMLCh *)0x0) {
    pXVar27 = L"xml";
  }
  if (!bVar28) {
    CVar24 = XIncludeXPointerNotSupported;
    goto LAB_00345c47;
  }
  XIncludeLocation::XIncludeLocation(&local_140,(XMLCh *)local_168);
  XIncludeLocation::XIncludeLocation(&local_130,(XMLCh *)local_168);
  iVar7 = (*xincludeNode->_vptr_DOMNode[0x1f])();
  pDVar13 = (DOMNode *)CONCAT44(extraout_var_02,iVar7);
  if (pDVar13 != (DOMNode *)0x0) {
    XIncludeLocation::prependPath(&local_140,(XMLCh *)pDVar13);
    local_168 = pDVar13;
  }
  pXVar12 = getBaseAttrValue(xincludeNode);
  if (pXVar12 != (XMLCh *)0x0) {
    local_168 = (DOMNode *)getBaseAttrValue(xincludeNode);
    XIncludeLocation::prependPath(&local_130,(XMLCh *)local_168);
  }
  if (pXVar27 == L"xml") {
LAB_00345ce1:
    pDVar15 = doXIncludeXMLFileDOM
                        (this,local_140.fHref,local_130.fHref,xincludeNode,parsedDocument,local_128)
    ;
    pDVar16 = (DOMText *)0x0;
  }
  else {
    pDVar13 = (DOMNode *)0x0;
    do {
      psVar20 = (short *)((long)pXVar27 + (long)pDVar13);
      if (*psVar20 == 0) {
        if (*(short *)((long)&fgXIIncludeParseAttrXMLValue + (long)pDVar13) == 0) goto LAB_00345ce1;
        break;
      }
      local_168 = (DOMNode *)((long)&pDVar13->_vptr_DOMNode + 2);
      psVar23 = (short *)((long)&fgXIIncludeParseAttrXMLValue + (long)pDVar13);
      pDVar13 = local_168;
    } while (*psVar20 == *psVar23);
    if (pXVar27 != L"text") {
      pDVar13 = (DOMNode *)0x0;
      do {
        psVar20 = (short *)((long)pXVar27 + (long)pDVar13);
        if (*psVar20 == 0) {
          if (*(short *)((long)&fgXIIncludeParseAttrTextValue + (long)pDVar13) == 0)
          goto LAB_00345d39;
          break;
        }
        local_168 = (DOMNode *)((long)&pDVar13->_vptr_DOMNode + 2);
        psVar23 = (short *)((long)&fgXIIncludeParseAttrTextValue + (long)pDVar13);
        pDVar13 = local_168;
      } while (*psVar20 == *psVar23);
      iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
      reportError(this,local_168,XIncludeInvalidParseVal,pXVar27,
                  (XMLCh *)CONCAT44(extraout_var_07,iVar7));
      bVar28 = false;
      goto LAB_0034698f;
    }
LAB_00345d39:
    pDVar16 = doXIncludeTEXTFileDOM
                        (this,local_140.fHref,local_130.fHref,local_158,xincludeNode,parsedDocument,
                         local_128);
    pDVar15 = (DOMDocument *)0x0;
  }
  local_118._vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_0040fc78;
  local_118.fAdoptedElems = false;
  local_118.fCurCount = 0;
  local_118.fMaxCount = 0xc;
  local_118.fElemList = (DOMNode **)0x0;
  local_118.fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pDVar13 = (DOMNode *)0x60;
  iVar7 = (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])();
  local_118.fElemList = (DOMNode **)CONCAT44(extraout_var_08,iVar7);
  lVar17 = 0;
  do {
    local_118.fElemList[lVar17] = (DOMNode *)0x0;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0xc);
  local_118._vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_0040f878;
  if (pDVar15 == (DOMDocument *)0x0 && pDVar16 == (DOMText *)0x0) {
    iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    reportError(this,pDVar13,XIncludeIncludeFailedResourceError,local_140.fHref,
                (XMLCh *)CONCAT44(extraout_var_09,iVar7));
    pDVar9 = &parsedDocument->super_DOMNode;
    if (local_e8 != (DOMNode *)0x0) {
      pDVar9 = local_e8;
    }
    if (plVar10 != (long *)0x0) {
      iVar7 = (*pDVar9->_vptr_DOMNode[0x1f])(pDVar9);
      XMLUri::XMLUri(&local_88,(XMLCh *)CONCAT44(extraout_var_10,iVar7),
                     XMLPlatformUtils::fgMemoryManager);
      pXVar27 = (XMLCh *)(**(code **)(*plVar10 + 0xf8))(plVar10);
      XMLUri::XMLUri(&local_e0,pXVar27,XMLPlatformUtils::fgMemoryManager);
      cVar6 = (**(code **)(*plVar10 + 0x90))(plVar10);
      if (cVar6 == '\0') {
        (*pDVar9->_vptr_DOMNode[0x10])(pDVar9,xincludeNode);
      }
      else {
        iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
        plVar14 = (long *)CONCAT44(extraout_var_11,iVar7);
        for (plVar18 = (long *)(**(code **)(*plVar10 + 0x38))(plVar10); plVar18 != (long *)0x0;
            plVar18 = (long *)(**(code **)(*plVar18 + 0x50))(plVar18)) {
          iVar7 = (**(code **)(*plVar18 + 0x20))(plVar18);
          if (iVar7 != 10) {
            iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                              (parsedDocument,plVar18,1);
            pDVar13 = (DOMNode *)CONCAT44(extraout_var_12,iVar7);
            iVar7 = (*pDVar13->_vptr_DOMNode[4])(pDVar13);
            if ((iVar7 == 1) && (local_88.fPath != local_e0.fPath)) {
              pXVar27 = local_e0.fPath;
              pXVar12 = local_88.fPath;
              if (local_e0.fPath == (XMLCh *)0x0 || local_88.fPath == (XMLCh *)0x0) {
                if (local_88.fPath == (XMLCh *)0x0) {
                  if (local_e0.fPath == (XMLCh *)0x0) goto LAB_00346019;
LAB_00345f67:
                  bVar28 = *pXVar27 == L'\0';
                }
                else {
                  bVar28 = *local_88.fPath == L'\0';
                  if (bVar28 && local_e0.fPath != (XMLCh *)0x0) goto LAB_00345f67;
                }
                if (bVar28) goto LAB_00346019;
              }
              else {
                do {
                  XVar1 = *pXVar12;
                  if (XVar1 == L'\0') goto LAB_00345f67;
                  pXVar12 = pXVar12 + 1;
                  XVar2 = *pXVar27;
                  pXVar27 = pXVar27 + 1;
                } while (XVar1 == XVar2);
              }
              pXVar27 = getBaseAttrValue(pDVar13);
              if (pXVar27 == (XMLCh *)0x0) {
                pDVar19 = (DOMNode *)(**(code **)(*plVar10 + 0x28))(plVar10);
                pXVar27 = getBaseAttrValue(pDVar19);
                (*pDVar13->_vptr_DOMNode[0x2c])(pDVar13,&fgXIBaseAttrName,pXVar27);
              }
              else {
                pXVar27 = getBaseAttrValue(pDVar13);
                XIncludeLocation::XIncludeLocation(&local_120,pXVar27);
                pDVar19 = (DOMNode *)(**(code **)(*plVar10 + 0x28))(plVar10);
                pXVar27 = getBaseAttrValue(pDVar19);
                if (pXVar27 != (XMLCh *)0x0) {
                  pDVar19 = (DOMNode *)(**(code **)(*plVar10 + 0x28))(plVar10);
                  pXVar27 = getBaseAttrValue(pDVar19);
                  XIncludeLocation::prependPath(&local_120,pXVar27);
                }
                (*pDVar13->_vptr_DOMNode[0x2c])(pDVar13,&fgXIBaseAttrName,local_120.fHref);
                XIncludeLocation::~XIncludeLocation(&local_120);
              }
            }
LAB_00346019:
            pDVar13 = (DOMNode *)(**(code **)(*plVar14 + 0x88))(plVar14,pDVar13);
            BaseRefVectorOf<xercesc_4_0::DOMNode>::ensureExtraCapacity(&local_118,1);
            local_118.fElemList[local_118.fCurCount] = pDVar13;
            local_118.fCurCount = local_118.fCurCount + 1;
          }
        }
        (*pDVar9->_vptr_DOMNode[0xf])(pDVar9,plVar14,xincludeNode);
        (**(code **)(*plVar14 + 0x138))(plVar14);
        if (local_118.fCurCount != 0) {
          XVar25 = 0;
          do {
            pDVar13 = BaseRefVectorOf<xercesc_4_0::DOMNode>::elementAt(&local_118,XVar25);
            parseDOMNodeDoingXInclude(this,pDVar13,parsedDocument,local_128);
            XVar25 = XVar25 + 1;
          } while (XVar25 < local_118.fCurCount);
        }
      }
      XMLUri::~XMLUri(&local_e0);
      XMLUri::~XMLUri(&local_88);
      bVar28 = true;
      goto LAB_0034696d;
    }
    iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    reportError(this,pDVar13,XIncludeIncludeFailedNoFallback,
                (XMLCh *)CONCAT44(extraout_var_34,iVar7),(XMLCh *)CONCAT44(extraout_var_35,iVar8));
    bVar28 = false;
  }
  else {
    if (pDVar15 == (DOMDocument *)0x0) {
      if (pDVar16 == (DOMText *)0x0) {
        bVar28 = false;
      }
      else {
        bVar28 = true;
        (*local_e8->_vptr_DOMNode[0xf])(local_e8,pDVar16,xincludeNode);
      }
    }
    else {
      addDocumentURIToCurrentInclusionHistoryStack(this,local_140.fHref);
      iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
      pDVar13 = (DOMNode *)CONCAT44(extraout_var_13,iVar7);
      iVar7 = (*(pDVar15->super_DOMNode)._vptr_DOMNode[7])(&pDVar15->super_DOMNode);
      pDVar9 = &parsedDocument->super_DOMNode;
      for (pXVar27 = (XMLCh *)CONCAT44(extraout_var_14,iVar7); pXVar27 != (XMLCh *)0x0;
          pXVar27 = (XMLCh *)(**(code **)(*(long *)pXVar27 + 0x50))(pXVar27)) {
        iVar7 = (**(code **)(*(long *)pXVar27 + 0x20))(pXVar27);
        if (iVar7 != 10) {
          iVar7 = (**(code **)(*(long *)pXVar27 + 0x20))(pXVar27);
          local_138 = pXVar27;
          if ((iVar7 == 1) &&
             (iVar7 = (*(pDVar15->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(),
             CONCAT44(extraout_var_15,iVar7) != 0)) {
            plVar14 = (long *)(**(code **)(*(long *)local_138 + 0x58))();
            lVar17 = (**(code **)(*plVar14 + 0x28))(plVar14);
            if (lVar17 != 0) {
              lVar26 = 0;
              do {
                plVar10 = (long *)(**(code **)(*plVar14 + 0x18))(plVar14,lVar26);
                plVar18 = (long *)(**(code **)(*plVar10 + 0x170))(plVar10);
                if (plVar18 != (long *)0x0) {
                  psVar20 = (short *)(**(code **)(*plVar18 + 0x18))(plVar18);
                  if (psVar20 == &XMLUni::fgInfosetURIName) {
LAB_00346199:
                    psVar20 = (short *)(**(code **)(*plVar18 + 0x10))(plVar18);
                    if (psVar20 == &XMLUni::fgNotationString) {
LAB_00346227:
                      pDVar19 = (DOMNode *)(**(code **)(*plVar10 + 0x18))(plVar10);
                      iVar7 = (*(pDVar15->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])();
                      plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_16,iVar7) +
                                                    0x150))((long *)CONCAT44(extraout_var_16,iVar7))
                      ;
                      plVar10 = (long *)(**(code **)(*plVar10 + 0x20))(plVar10,pDVar19);
                      iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb]
                              )(parsedDocument);
                      if (CONCAT44(extraout_var_17,iVar7) == 0) {
                        iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xd])(parsedDocument);
                        uVar21 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar7) + 0x10))
                                           ((long *)CONCAT44(extraout_var_18,iVar7));
                        iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0x24])(parsedDocument,uVar21,0,0);
                        iVar8 = (*pDVar9->_vptr_DOMNode[7])();
                        (*pDVar9->_vptr_DOMNode[0xe])
                                  (pDVar9,CONCAT44(extraout_var_19,iVar7),
                                   CONCAT44(extraout_var_20,iVar8));
                      }
                      iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb]
                              )(parsedDocument);
                      plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_21,iVar7) +
                                                    0x150))((long *)CONCAT44(extraout_var_21,iVar7))
                      ;
                      pDVar22 = pDVar19;
                      plVar18 = (long *)(**(code **)(*plVar18 + 0x20))(plVar18);
                      if (plVar18 == (long *)0x0) {
                        iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])();
                        plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_22,iVar7) +
                                                      0x150))((long *)CONCAT44(extraout_var_22,iVar7
                                                                              ));
                        iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xf])(parsedDocument,plVar10,1);
                        (**(code **)(*plVar18 + 0x10))(plVar18,iVar7);
                        goto LAB_0034678f;
                      }
                      psVar23 = (short *)(**(code **)(*plVar18 + 0x140))(plVar18);
                      psVar20 = (short *)(**(code **)(*plVar10 + 0x140))(plVar10);
                      if (psVar23 == psVar20) {
LAB_00346538:
                        psVar23 = (short *)(**(code **)(*plVar18 + 0x148))(plVar18);
                        psVar20 = (short *)(**(code **)(*plVar10 + 0x148))(plVar10);
                        if (psVar23 != psVar20) {
                          if ((psVar23 != (short *)0x0) && (psVar20 != (short *)0x0)) {
                            do {
                              sVar3 = *psVar23;
                              if (sVar3 == 0) goto LAB_003465a2;
                              psVar23 = psVar23 + 1;
                              sVar4 = *psVar20;
                              psVar20 = psVar20 + 1;
                            } while (sVar3 == sVar4);
                            goto LAB_003466c0;
                          }
                          if (psVar23 == (short *)0x0) {
                            if (psVar20 == (short *)0x0) goto LAB_003465b1;
LAB_003465a2:
                            bVar28 = *psVar20 == 0;
                          }
                          else {
                            bVar28 = *psVar23 == 0;
                            if ((psVar20 != (short *)0x0) && (*psVar23 == 0)) goto LAB_003465a2;
                          }
                          if (!bVar28) goto LAB_003466c0;
                        }
LAB_003465b1:
                        psVar23 = (short *)(**(code **)(*plVar18 + 0xf8))(plVar18);
                        psVar20 = (short *)(**(code **)(*plVar10 + 0xf8))(plVar10);
                        if (psVar23 == psVar20) goto LAB_0034678f;
                        if ((psVar23 != (short *)0x0) && (psVar20 != (short *)0x0)) {
                          do {
                            sVar3 = *psVar23;
                            if (sVar3 == 0) goto LAB_003466b1;
                            psVar23 = psVar23 + 1;
                            sVar4 = *psVar20;
                            psVar20 = psVar20 + 1;
                          } while (sVar3 == sVar4);
                          goto LAB_003466c0;
                        }
                        if (psVar23 == (short *)0x0) {
                          if (psVar20 == (short *)0x0) goto LAB_0034678f;
LAB_003466b1:
                          bVar28 = *psVar20 == 0;
                        }
                        else {
                          bVar28 = *psVar23 == 0;
                          if ((psVar20 != (short *)0x0) && (*psVar23 == 0)) goto LAB_003466b1;
                        }
                        if (bVar28) goto LAB_0034678f;
                      }
                      else if ((psVar23 == (short *)0x0) || (psVar20 == (short *)0x0)) {
                        if (psVar23 == (short *)0x0) {
                          if (psVar20 == (short *)0x0) goto LAB_00346538;
LAB_00346529:
                          bVar28 = *psVar20 == 0;
                        }
                        else {
                          bVar28 = *psVar23 == 0;
                          if ((psVar20 != (short *)0x0) && (*psVar23 == 0)) goto LAB_00346529;
                        }
                        if (bVar28) goto LAB_00346538;
                      }
                      else {
                        do {
                          sVar3 = *psVar23;
                          if (sVar3 == 0) goto LAB_00346529;
                          psVar23 = psVar23 + 1;
                          sVar4 = *psVar20;
                          psVar20 = psVar20 + 1;
                        } while (sVar3 == sVar4);
                      }
LAB_003466c0:
                      iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                [0x1a])();
                      reportError(this,pDVar22,XIncludeConflictingNotation,(XMLCh *)pDVar19,
                                  (XMLCh *)CONCAT44(extraout_var_30,iVar7));
                    }
                    else {
                      psVar23 = &XMLUni::fgNotationString;
                      if (psVar20 == (short *)0x0) {
LAB_003461d3:
                        if (*psVar23 == 0) goto LAB_00346227;
                      }
                      else {
                        psVar23 = &XMLUni::fgNotationString;
                        do {
                          sVar3 = *psVar20;
                          if (sVar3 == 0) goto LAB_003461d3;
                          psVar20 = psVar20 + 1;
                          sVar4 = *psVar23;
                          psVar23 = psVar23 + 1;
                        } while (sVar3 == sVar4);
                      }
                      psVar20 = (short *)(**(code **)(*plVar18 + 0x10))(plVar18);
                      if (psVar20 == &XMLUni::fgEntityString) {
LAB_00346385:
                        pDVar19 = (DOMNode *)(**(code **)(*plVar10 + 0x18))(plVar10);
                        iVar7 = (*(pDVar15->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])();
                        plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar7) +
                                                      0x148))((long *)CONCAT44(extraout_var_23,iVar7
                                                                              ));
                        plVar10 = (long *)(**(code **)(*plVar10 + 0x20))(plVar10,pDVar19);
                        iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])(parsedDocument);
                        if (CONCAT44(extraout_var_24,iVar7) == 0) {
                          iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xd])(parsedDocument);
                          uVar21 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar7) + 0x10))
                                             ((long *)CONCAT44(extraout_var_25,iVar7));
                          iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0x24])(parsedDocument,uVar21,0,0);
                          iVar8 = (*pDVar9->_vptr_DOMNode[7])();
                          (*pDVar9->_vptr_DOMNode[0xe])
                                    (pDVar9,CONCAT44(extraout_var_26,iVar7),
                                     CONCAT44(extraout_var_27,iVar8));
                        }
                        iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])(parsedDocument);
                        plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_28,iVar7) +
                                                      0x148))((long *)CONCAT44(extraout_var_28,iVar7
                                                                              ));
                        pDVar22 = pDVar19;
                        plVar18 = (long *)(**(code **)(*plVar18 + 0x20))(plVar18);
                        if (plVar18 == (long *)0x0) {
                          iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xb])();
                          plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_29,iVar7) +
                                                        0x148))((long *)CONCAT44(extraout_var_29,
                                                                                 iVar7));
                          iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xf])(parsedDocument,plVar10,1);
                          (**(code **)(*plVar18 + 0x10))(plVar18,iVar7);
                        }
                        else {
                          psVar23 = (short *)(**(code **)(*plVar18 + 0x140))(plVar18);
                          psVar20 = (short *)(**(code **)(*plVar10 + 0x140))(plVar10);
                          if (psVar23 == psVar20) {
LAB_0034663f:
                            psVar23 = (short *)(**(code **)(*plVar18 + 0x148))(plVar18);
                            psVar20 = (short *)(**(code **)(*plVar10 + 0x148))(plVar10);
                            if (psVar23 != psVar20) {
                              if ((psVar23 != (short *)0x0) && (psVar20 != (short *)0x0)) {
                                do {
                                  sVar3 = *psVar23;
                                  if (sVar3 == 0) goto LAB_003466ef;
                                  psVar23 = psVar23 + 1;
                                  sVar4 = *psVar20;
                                  psVar20 = psVar20 + 1;
                                } while (sVar3 == sVar4);
                                goto LAB_0034676a;
                              }
                              if (psVar23 == (short *)0x0) {
                                if (psVar20 == (short *)0x0) goto LAB_003466fa;
LAB_003466ef:
                                bVar28 = *psVar20 == 0;
                              }
                              else {
                                bVar28 = *psVar23 == 0;
                                if ((psVar20 != (short *)0x0) && (*psVar23 == 0)) goto LAB_003466ef;
                              }
                              if (!bVar28) goto LAB_0034676a;
                            }
LAB_003466fa:
                            psVar23 = (short *)(**(code **)(*plVar18 + 0xf8))(plVar18);
                            psVar20 = (short *)(**(code **)(*plVar10 + 0xf8))(plVar10);
                            if (psVar23 == psVar20) goto LAB_0034678f;
                            if ((psVar23 != (short *)0x0) && (psVar20 != (short *)0x0)) {
                              do {
                                sVar3 = *psVar23;
                                if (sVar3 == 0) goto LAB_0034675f;
                                psVar23 = psVar23 + 1;
                                sVar4 = *psVar20;
                                psVar20 = psVar20 + 1;
                              } while (sVar3 == sVar4);
                              goto LAB_0034676a;
                            }
                            if (psVar23 == (short *)0x0) {
                              if (psVar20 == (short *)0x0) goto LAB_0034678f;
LAB_0034675f:
                              bVar28 = *psVar20 == 0;
                            }
                            else {
                              bVar28 = *psVar23 == 0;
                              if ((psVar20 != (short *)0x0) && (*psVar23 == 0)) goto LAB_0034675f;
                            }
                            if (bVar28) goto LAB_0034678f;
                          }
                          else if ((psVar23 == (short *)0x0) || (psVar20 == (short *)0x0)) {
                            if (psVar23 == (short *)0x0) {
                              if (psVar20 == (short *)0x0) goto LAB_0034663f;
LAB_00346630:
                              bVar28 = *psVar20 == 0;
                            }
                            else {
                              bVar28 = *psVar23 == 0;
                              if ((psVar20 != (short *)0x0) && (*psVar23 == 0)) goto LAB_00346630;
                            }
                            if (bVar28) goto LAB_0034663f;
                          }
                          else {
                            do {
                              sVar3 = *psVar23;
                              if (sVar3 == 0) goto LAB_00346630;
                              psVar23 = psVar23 + 1;
                              sVar4 = *psVar20;
                              psVar20 = psVar20 + 1;
                            } while (sVar3 == sVar4);
                          }
LAB_0034676a:
                          iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0x1a])();
                          reportError(this,pDVar22,XIncludeConflictingEntity,(XMLCh *)pDVar19,
                                      (XMLCh *)CONCAT44(extraout_var_31,iVar7));
                        }
                      }
                      else {
                        psVar23 = &XMLUni::fgEntityString;
                        if (psVar20 == (short *)0x0) {
LAB_0034637b:
                          if (*psVar23 == 0) goto LAB_00346385;
                        }
                        else {
                          psVar23 = &XMLUni::fgEntityString;
                          do {
                            sVar3 = *psVar20;
                            if (sVar3 == 0) goto LAB_0034637b;
                            psVar20 = psVar20 + 1;
                            sVar4 = *psVar23;
                            psVar23 = psVar23 + 1;
                          } while (sVar3 == sVar4);
                        }
                      }
                    }
                  }
                  else {
                    psVar23 = &XMLUni::fgInfosetURIName;
                    if (psVar20 == (short *)0x0) {
LAB_0034618f:
                      if (*psVar23 == 0) goto LAB_00346199;
                    }
                    else {
                      psVar23 = &XMLUni::fgInfosetURIName;
                      do {
                        sVar3 = *psVar20;
                        if (sVar3 == 0) goto LAB_0034618f;
                        psVar20 = psVar20 + 1;
                        sVar4 = *psVar23;
                        psVar23 = psVar23 + 1;
                      } while (sVar3 == sVar4);
                    }
                  }
                }
LAB_0034678f:
                lVar26 = lVar26 + 1;
              } while (lVar26 != lVar17);
            }
          }
          pXVar27 = local_138;
          iVar7 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                            (parsedDocument,local_138,1);
          iVar7 = (*pDVar13->_vptr_DOMNode[0x11])(pDVar13,CONCAT44(extraout_var_32,iVar7));
          BaseRefVectorOf<xercesc_4_0::DOMNode>::ensureExtraCapacity(&local_118,1);
          local_118.fElemList[local_118.fCurCount] = (DOMNode *)CONCAT44(extraout_var_33,iVar7);
          local_118.fCurCount = local_118.fCurCount + 1;
        }
      }
      pDVar9 = pDVar13;
      (*local_e8->_vptr_DOMNode[0xf])(local_e8,pDVar13,xincludeNode);
      (*pDVar13->_vptr_DOMNode[0x27])();
      if (local_118.fCurCount != 0) {
        XVar25 = 0;
        do {
          pDVar9 = BaseRefVectorOf<xercesc_4_0::DOMNode>::elementAt(&local_118,XVar25);
          parseDOMNodeDoingXInclude(this,pDVar9,parsedDocument,local_128);
          XVar25 = XVar25 + 1;
        } while (XVar25 < local_118.fCurCount);
      }
      bVar28 = true;
      popFromCurrentInclusionHistoryStack(this,(XMLCh *)pDVar9);
    }
LAB_0034696d:
    if (pDVar15 != (DOMDocument *)0x0) {
      (*(pDVar15->super_DOMNode)._vptr_DOMNode[0x27])(&pDVar15->super_DOMNode);
    }
  }
  RefVectorOf<xercesc_4_0::DOMNode>::~RefVectorOf((RefVectorOf<xercesc_4_0::DOMNode> *)&local_118);
LAB_0034698f:
  XIncludeLocation::~XIncludeLocation(&local_130);
  XIncludeLocation::~XIncludeLocation(&local_140);
  return bVar28;
}

Assistant:

bool
XIncludeUtils::doDOMNodeXInclude(DOMNode *xincludeNode, DOMDocument *parsedDocument, XMLEntityHandler* entityResolver){
    bool modifiedNode = false;
    /* the relevant attributes to look for */
    const XMLCh *href = NULL;
    const XMLCh *parse = NULL;
    const XMLCh *xpointer = NULL;
    const XMLCh *encoding = NULL;
//    const XMLCh *accept = NULL;
//    const XMLCh *acceptlanguage = NULL;
    DOMNode *includeParent = xincludeNode->getParentNode();


    if(xincludeNode->hasAttributes()) {
        /* get all the attributes of the node */
        DOMNamedNodeMap *pAttributes = xincludeNode->getAttributes();
        XMLSize_t nSize = pAttributes->getLength();
        for(XMLSize_t i=0;i<nSize;++i) {
            DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
            const XMLCh *attrName = pAttributeNode->getName();
            /* check each attribute against the potential useful names */
            if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeHREFAttrName)){
                href = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeParseAttrName)){
                parse = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeXPointerAttrName)){
                xpointer = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeEncodingAttrName)){
                encoding = pAttributeNode->getValue();
//            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeAcceptAttrName)){
//                accept = pAttributeNode->getValue();
//            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeAcceptLanguageAttrName)){
//                acceptlanguage = pAttributeNode->getValue();
            } else {
                /* if any other attribute is in the xi namespace, it's an error */
                const XMLCh *attrNamespaceURI = pAttributeNode->getNamespaceURI();
                if (attrNamespaceURI && XMLString::equals(attrNamespaceURI, XIncludeUtils::fgXIIIncludeNamespaceURI)){
                } else {
                    /* ignore - any other attribute is allowed according to spec,
                       and must be ignored */
                }
            }
        }
    }
    // 3.1 xi:include Element
    // The children property of the xi:include element may include a single xi:fallback element;
    // the appearance of more than one xi:fallback element, an xi:include element,
    // or any other element from the XInclude namespace is a fatal error.
    DOMNode *child;
    DOMElement *fallback = NULL;
    for (child = xincludeNode->getFirstChild(); child != 0; child=child->getNextSibling()){
        if(child->getNodeType()!=DOMNode::ELEMENT_NODE)
            continue;
        if ( isXIFallbackDOMNode(child) ){
            if (fallback != NULL){
                /* fatal error - there are more than one fallback children */
                XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeMultipleFallbackElems,
                    parsedDocument->getDocumentURI(), parsedDocument->getDocumentURI());
                return false;
            }
            fallback = (DOMElement*)child;
        }
        else if(isXIIncludeDOMNode(child) || XMLString::equals(child->getNamespaceURI(), XIncludeUtils::fgXIIIncludeNamespaceURI)) {
            /* fatal error - an xi element different from xi:fallback is a child of xi:include */
            XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeDisallowedChild,
                child->getNodeName(), parsedDocument->getDocumentURI());
            return false;
        }
    }

    if (href == NULL){
        /* this is an unrecoverable error until we have xpointer support -
           if there is an xpointer, the current document is assumed
           however, there is no xpointer support yet */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeNoHref,
            NULL, parsedDocument->getDocumentURI());
        return false;
    }

    /* set up the accept and accept-language values */
//    if (accept != NULL){
//
//    }

    if (parse == NULL){
        /* use the default, as specified */
        parse = XIncludeUtils::fgXIIncludeParseAttrXMLValue;
    }

    if (xpointer != NULL){
        /* not supported yet */
        /* Note that finding an xpointer attr along with parse="text" is a Fatal Error
         *  - http://www.w3.org/TR/xinclude/#include-location */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeXPointerNotSupported,
            NULL, href);
        return false;
    }

    /* set up the href according to what has gone before */
    XIncludeLocation hrefLoc(href);
    XIncludeLocation relativeLocation(href);
    const XMLCh *includeBase = xincludeNode->getBaseURI();
    if (includeBase != NULL){
        hrefLoc.prependPath(includeBase);
    }

    if (getBaseAttrValue(xincludeNode) != NULL){
        relativeLocation.prependPath(getBaseAttrValue(xincludeNode));
    }

    /*  Take the relevant action - we need to retrieve the target as a whole before
        we can know if it was successful or not, therefore the do* methods do
        not modify the parsedDocument. Swapping the results in is left to the
        caller (i.e. here) */
    DOMText *includedText = NULL;
    DOMDocument *includedDoc = NULL;
    if (XMLString::equals(parse, XIncludeUtils::fgXIIncludeParseAttrXMLValue)){
        /* including a XML element */
        includedDoc = doXIncludeXMLFileDOM(hrefLoc.getLocation(), relativeLocation.getLocation(), xincludeNode, parsedDocument, entityResolver);
    } else if (XMLString::equals(parse, XIncludeUtils::fgXIIncludeParseAttrTextValue)){
        /* including a text value */
        includedText = doXIncludeTEXTFileDOM(hrefLoc.getLocation(), relativeLocation.getLocation(), encoding, xincludeNode, parsedDocument, entityResolver);
    } else {
        /* invalid parse attribute value - fatal error according to the specification */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeInvalidParseVal,
            parse, parsedDocument->getDocumentURI());
        return false;
    }

    RefVectorOf<DOMNode> delayedProcessing(12,false);
    if (includedDoc == NULL && includedText == NULL){
        /* there was an error - this is now a resource error
           let's see if there is a fallback */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeIncludeFailedResourceError,
            hrefLoc.getLocation(), parsedDocument->getDocumentURI());

        if (includeParent == NULL){
            includeParent = parsedDocument;
        }

        // we could be getting errors trying to insert elements at the root of the document, so we should use replaceChild;
        // in order to handle multiple nodes, add them to a document fragment and use that to replace the original node
        if (fallback){
            /* baseURI fixups - see http://www.w3.org/TR/xinclude/#base for details. */
            XMLUri parentURI(includeParent->getBaseURI());
            XMLUri includedURI(fallback->getBaseURI());

            if (fallback->hasChildNodes()){
                DOMDocumentFragment* frag = parsedDocument->createDocumentFragment();
                DOMNode *child = fallback->getFirstChild();
                /* add the content of the fallback element, and remove the fallback elem itself */
                for ( ; child != NULL ; child=child->getNextSibling()){
                    if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE){
                        continue;
                    }
                    DOMNode *newNode = parsedDocument->importNode(child, true);
                    /* if the paths differ we need to add a base attribute */
                    if (newNode->getNodeType()==DOMNode::ELEMENT_NODE && !XMLString::equals(parentURI.getPath(), includedURI.getPath())){
                        if (getBaseAttrValue(newNode) == NULL){
                            /* need to calculate the proper path difference to get the relativePath */
                            ((DOMElement*)newNode)->setAttribute(fgXIBaseAttrName, getBaseAttrValue(fallback->getParentNode()));
                        } else {
                            /* the included node has base of its own which takes precedence */
                            XIncludeLocation xil(getBaseAttrValue(newNode));
                            if (getBaseAttrValue(fallback->getParentNode()) != NULL){
                                /* prepend any specific base modification of the xinclude node */
                                xil.prependPath(getBaseAttrValue(fallback->getParentNode()));
                            }
                            ((DOMElement*)newNode)->setAttribute(fgXIBaseAttrName, xil.getLocation());
                        }
                    }
                    DOMNode *newChild = frag->appendChild(newNode);
                    // don't process the node now, wait until it is placed in the final position
                    delayedProcessing.addElement(newChild);
                    //parseDOMNodeDoingXInclude(newChild, parsedDocument, entityResolver);
                }
                includeParent->replaceChild(frag, xincludeNode);
                frag->release();

                for(XMLSize_t i=0;i<delayedProcessing.size();i++)
                {
                    DOMNode* childNode=delayedProcessing.elementAt(i);
                    parseDOMNodeDoingXInclude(childNode, parsedDocument, entityResolver);
                }
                modifiedNode = true;
            } else {
                /* empty fallback element - simply remove it! */
                includeParent->removeChild(xincludeNode);
                modifiedNode = true;
            }
        } else {
            XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeIncludeFailedNoFallback,
                parsedDocument->getDocumentURI(), parsedDocument->getDocumentURI());
            return false;
        }
    } else {
        if (includedDoc){
            /* record the successful include while we process the children */
            addDocumentURIToCurrentInclusionHistoryStack(hrefLoc.getLocation());

            DOMDocumentFragment* frag = parsedDocument->createDocumentFragment();
            /* need to import the document prolog here */
            DOMNode *child = includedDoc->getFirstChild();
            for (; child != NULL; child = child->getNextSibling()) {
                if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE)
                    continue;
                // check for NOTATION or ENTITY clash
                if(child->getNodeType()==DOMNode::ELEMENT_NODE && includedDoc->getDoctype()!=NULL) {
                    DOMNamedNodeMap *pAttributes = child->getAttributes();
                    XMLSize_t nSize = pAttributes->getLength();
                    for(XMLSize_t i=0;i<nSize;++i) {
                        DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                        const DOMTypeInfo * typeInfo=pAttributeNode->getSchemaTypeInfo();
                        if(typeInfo && XMLString::equals(typeInfo->getTypeNamespace(), XMLUni::fgInfosetURIName)) {
                            if(XMLString::equals(typeInfo->getTypeName(), XMLUni::fgNotationString)) {
                                const XMLCh* notationName=pAttributeNode->getNodeValue();
                                DOMNotation* notat=(DOMNotation*)includedDoc->getDoctype()->getNotations()->getNamedItem(notationName);
                                // ensure we have a DTD
                                if(parsedDocument->getDoctype()==NULL)
                                    parsedDocument->insertBefore(parsedDocument->createDocumentType(parsedDocument->getDocumentElement()->getNodeName(), NULL,NULL), parsedDocument->getFirstChild());
                                DOMNotation* myNotation=(DOMNotation*)parsedDocument->getDoctype()->getNotations()->getNamedItem(notationName);
                                if(myNotation==NULL)
                                {
                                    // it's missing, add it
                                    parsedDocument->getDoctype()->getNotations()->setNamedItem(parsedDocument->importNode(notat, true));
                                }
                                else if(XMLString::equals(myNotation->getPublicId(), notat->getPublicId()) &&
                                        XMLString::equals(myNotation->getSystemId(), notat->getSystemId()) &&
                                        XMLString::equals(myNotation->getBaseURI(), notat->getBaseURI()))
                                {
                                    // it's duplicate, ignore it
                                }
                                else
                                {
                                    // it's a conflict, report it
                                    XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeConflictingNotation,
                                        notationName, parsedDocument->getDocumentURI());
                                }
                            }
                            else if(XMLString::equals(typeInfo->getTypeName(), XMLUni::fgEntityString)) {
                                const XMLCh* entityName=pAttributeNode->getNodeValue();
                                DOMEntity* ent=(DOMEntity*)includedDoc->getDoctype()->getEntities()->getNamedItem(entityName);
                                // ensure we have a DTD
                                if(parsedDocument->getDoctype()==NULL)
                                    parsedDocument->insertBefore(parsedDocument->createDocumentType(parsedDocument->getDocumentElement()->getNodeName(), NULL,NULL), parsedDocument->getFirstChild());
                                DOMEntity* myEnt=(DOMEntity*)parsedDocument->getDoctype()->getEntities()->getNamedItem(entityName);
                                if(myEnt==NULL)
                                {
                                    // it's missing, add it
                                    parsedDocument->getDoctype()->getEntities()->setNamedItem(parsedDocument->importNode(ent, true));
                                }
                                else if(XMLString::equals(myEnt->getPublicId(), ent->getPublicId()) &&
                                        XMLString::equals(myEnt->getSystemId(), ent->getSystemId()) &&
                                        XMLString::equals(myEnt->getBaseURI(), ent->getBaseURI()))
                                {
                                    // it's duplicate, ignore it
                                }
                                else
                                {
                                    // it's a conflict, report it
                                    XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeConflictingEntity,
                                        entityName, parsedDocument->getDocumentURI());
                                }
                            }
                        }
                    }
                }
                DOMNode *newNode = parsedDocument->importNode(child, true);
                DOMNode *newChild = frag->appendChild(newNode);
                // don't process the node now, wait until it is placed in the final position
                delayedProcessing.addElement(newChild);
                //parseDOMNodeDoingXInclude(newChild, parsedDocument, entityResolver);
            }
            includeParent->replaceChild(frag, xincludeNode);
            frag->release();

            for(XMLSize_t i=0;i<delayedProcessing.size();i++)
            {
                DOMNode* childNode=delayedProcessing.elementAt(i);
                parseDOMNodeDoingXInclude(childNode, parsedDocument, entityResolver);
            }
            popFromCurrentInclusionHistoryStack(NULL);
            modifiedNode = true;
        } else if (includedText){
            includeParent->replaceChild(includedText, xincludeNode);
            modifiedNode = true;
        }
    }

    if (includedDoc)
        includedDoc->release();

    return modifiedNode;
}